

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t init_traditional_PKWARE_decryption(archive_read *a)

{
  void *pvVar1;
  wchar_t wVar2;
  uint8_t *in;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint8_t local_3c [11];
  char local_31;
  
  pvVar1 = a->format->data;
  wVar2 = L'\0';
  if (*(char *)((long)pvVar1 + 0x184) == '\0') {
    if (((*(byte *)(*(long *)((long)pvVar1 + 0x68) + 0x7e) & 8) == 0) &&
       (*(long *)((long)pvVar1 + 0x70) < 0xc)) {
      archive_set_error(&a->archive,0x54,"Truncated Zip encrypted body: only %jd bytes available");
    }
    else {
      iVar6 = 0;
      in = (uint8_t *)__archive_read_ahead(a,0xc,(ssize_t *)0x0);
      if (in != (uint8_t *)0x0) {
        do {
          pcVar3 = __archive_read_next_passphrase(a);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = "Incorrect passphrase";
            if (iVar6 == 0) {
              pcVar3 = "Passphrase required for this entry";
            }
LAB_0017dab4:
            archive_set_error(&a->archive,-1,pcVar3);
            return L'\xffffffe7';
          }
          sVar4 = strlen(pcVar3);
          *(undefined8 *)((long)pvVar1 + 0x178) = 0x2345678912345678;
          *(undefined4 *)((long)pvVar1 + 0x180) = 0x34567890;
          for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
            trad_enc_update_keys((trad_enc_ctx *)((long)pvVar1 + 0x178),pcVar3[sVar5]);
          }
          trad_enc_decrypt_update((trad_enc_ctx *)((long)pvVar1 + 0x178),in,0xc,local_3c,0xc);
          if (local_31 == *(char *)(*(long *)((long)pvVar1 + 0x68) + 0x83)) {
            __archive_read_consume(a,0xc);
            *(undefined1 *)((long)pvVar1 + 0x184) = 1;
            if ((*(byte *)(*(long *)((long)pvVar1 + 0x68) + 0x7e) & 8) == 0) {
              *(long *)((long)pvVar1 + 0x70) = *(long *)((long)pvVar1 + 0x70) + -0xc;
            }
            *(long *)((long)pvVar1 + 0x78) = *(long *)((long)pvVar1 + 0x78) + 0xc;
            *(undefined8 *)((long)pvVar1 + 0x168) = 0;
            wVar2 = zip_alloc_decryption_buffer(a);
            return wVar2;
          }
          if (iVar6 == 0x2711) {
            pcVar3 = "Too many incorrect passphrases";
            goto LAB_0017dab4;
          }
          iVar6 = iVar6 + 1;
        } while( true );
      }
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
    }
    wVar2 = L'\xffffffe2';
  }
  return wVar2;
}

Assistant:

static int
init_traditional_PKWARE_decryption(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const void *p;
	int retry;
	int r;

	if (zip->tctx_valid)
		return (ARCHIVE_OK);

	/*
	   Read the 12 bytes encryption header stored at
	   the start of the data area.
	 */
#define ENC_HEADER_SIZE	12
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < ENC_HEADER_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated Zip encrypted body: only %jd bytes available",
		    (intmax_t)zip->entry_bytes_remaining);
		return (ARCHIVE_FATAL);
	}

	p = __archive_read_ahead(a, ENC_HEADER_SIZE, NULL);
	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file data");
		return (ARCHIVE_FATAL);
	}

	for (retry = 0;; retry++) {
		const char *passphrase;
		uint8_t crcchk;

		passphrase = __archive_read_next_passphrase(a);
		if (passphrase == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    (retry > 0)?
				"Incorrect passphrase":
				"Passphrase required for this entry");
			return (ARCHIVE_FAILED);
		}

		/*
		 * Initialize ctx for Traditional PKWARE Decyption.
		 */
		r = trad_enc_init(&zip->tctx, passphrase, strlen(passphrase),
			p, ENC_HEADER_SIZE, &crcchk);
		if (r == 0 && crcchk == zip->entry->decdat)
			break;/* The passphrase is OK. */
		if (retry > 10000) {
			/* Avoid infinity loop. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Too many incorrect passphrases");
			return (ARCHIVE_FAILED);
		}
	}

	__archive_read_consume(a, ENC_HEADER_SIZE);
	zip->tctx_valid = 1;
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
	    zip->entry_bytes_remaining -= ENC_HEADER_SIZE;
	}
	/*zip->entry_uncompressed_bytes_read += ENC_HEADER_SIZE;*/
	zip->entry_compressed_bytes_read += ENC_HEADER_SIZE;
	zip->decrypted_bytes_remaining = 0;

	return (zip_alloc_decryption_buffer(a));
#undef ENC_HEADER_SIZE
}